

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjDecodeYUVPlanes(tjhandle handle,uchar **srcPlanes,int *strides,int subsamp,uchar *dstBuf,
                     int width,int pitch,int height,int pixelFormat,int flags)

{
  jpeg_decompress_struct *dinfo;
  __jmp_buf_tag *__env;
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  JDIMENSION JVar6;
  int iVar7;
  void *__ptr;
  void *pvVar8;
  void *pvVar9;
  int extraout_EDX;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uchar *puVar13;
  JDIMENSION JVar14;
  tjinstance *this;
  char *__string;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uchar *_tmpbuf_aligned;
  long lVar18;
  uint uVar19;
  int *piVar20;
  long *in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ulong uVar28;
  JDIMENSION outrow;
  JDIMENSION inrow;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *inbuf [10];
  JSAMPLE *_tmpbuf [10];
  int pw [10];
  undefined4 local_190;
  undefined4 local_18c;
  long local_188;
  long local_180;
  void *local_178;
  __jmp_buf_tag *local_170;
  uchar **local_168;
  int *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  JDIMENSION aJStack_58 [10];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  dinfo = (jpeg_decompress_struct *)((long)handle + 0x208);
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecodeYUVPlanes(): Instance has not been initialized for decompression",0x49);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),
           "tjDecodeYUVPlanes(): Instance has not been initialized for decompression",0x49);
    uVar19 = 0xffffffff;
    __ptr = (void *)0x0;
    goto LAB_0010dbf1;
  }
  if ((((((srcPlanes == (uchar **)0x0) || (0xb < (uint)pixelFormat)) || (height < 1)) ||
       ((pitch < 0 || (width < 1)))) ||
      ((dstBuf == (uchar *)0x0 || ((5 < (uint)subsamp || (*srcPlanes == (uchar *)0x0)))))) ||
     ((subsamp != 3 && ((srcPlanes[1] == (uchar *)0x0 || (srcPlanes[2] == (uchar *)0x0)))))) {
    builtin_strncpy((char *)((long)handle + 0x618),"s(): Inv",8);
    builtin_strncpy((char *)((long)handle + 0x620),"alid arg",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x626) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xb2) = 0x746e656d756772;
    in_FS_OFFSET[-0x18] = 0x766e49203a292873;
    in_FS_OFFSET[-0x17] = 0x6772612064696c61;
    in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
    in_FS_OFFSET[-0x19] = 0x656e616c50565559;
    __ptr = (void *)0x0;
  }
  else {
    __env = (__jmp_buf_tag *)((long)handle + 0x528);
    local_168 = srcPlanes;
    local_160 = strides;
    iVar5 = _setjmp(__env);
    if (iVar5 == 0) {
      local_170 = __env;
      if (pixelFormat != 0xb) {
        if (pitch == 0) {
          pitch = tjPixelSize[(uint)pixelFormat] * width;
        }
        *(int *)((long)handle + 0x238) = width;
        *(int *)((long)handle + 0x23c) = height;
        if ((flags & 8U) == 0) {
          if ((flags & 0x10U) != 0) {
            __string = "JSIMD_FORCESSE=1";
            goto LAB_0010dcd8;
          }
          iVar5 = height;
          if ((flags & 0x20U) != 0) {
            __string = "JSIMD_FORCESSE2=1";
            goto LAB_0010dcd8;
          }
        }
        else {
          __string = "JSIMD_FORCEMMX=1";
LAB_0010dcd8:
          putenv(__string);
          iVar5 = extraout_EDX;
        }
        *(undefined4 *)(*(long *)((long)handle + 0x448) + 0x20) = 0;
        *(undefined4 *)((long)handle + 0x340) = 0;
        *(undefined8 *)((long)handle + 0x414) = 0x3f00000000;
        *(undefined8 *)((long)handle + 0x41c) = 0;
        setDecodeDefaults(dinfo,subsamp,iVar5,0);
        puVar2 = *(undefined8 **)((long)handle + 0x450);
        local_158 = *puVar2;
        uStack_150 = puVar2[1];
        puVar2[1] = my_read_markers;
        *puVar2 = my_reset_marker_reader;
        jpeg_read_header(dinfo,1);
        puVar2 = *(undefined8 **)((long)handle + 0x450);
        *puVar2 = local_158;
        puVar2[1] = uStack_150;
        *(J_COLOR_SPACE *)((long)handle + 0x248) = pf2cs[(uint)pixelFormat];
        if (((uint)flags >> 0xb & 1) != 0) {
          *(undefined4 *)((long)handle + 0x268) = 1;
        }
        *(undefined4 *)((long)handle + 0x26c) = 0;
        *(undefined4 *)((long)handle + 0x418) = 0x3f;
        jinit_master_decompress(dinfo);
        (*(code *)**(undefined8 **)((long)handle + 0x468))(dinfo);
        iVar5 = *(int *)((long)handle + 0x3a4);
        uVar19 = -iVar5 & (height + iVar5) - 1U;
        if (pitch == 0) {
          pitch = tjPixelSize[(uint)pixelFormat] * *(int *)((long)handle + 0x290);
        }
        iVar1 = *(int *)((long)handle + 0x3a0);
        __ptr = malloc((long)(int)uVar19 << 3);
        auVar4 = _DAT_0015d0d0;
        if (__ptr == (void *)0x0) {
          builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
          builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
          builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
          builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
          builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
          builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
          *(undefined4 *)((long)handle + 0x6d0) = 1;
          builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
          builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
          in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
          in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
          in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
          in_FS_OFFSET[-0x19] = 0x656e616c50565559;
          __ptr = (void *)0x0;
          uVar19 = 0xffffffff;
        }
        else {
          uVar16 = (ulong)(uint)height;
          lVar18 = uVar16 - 1;
          auVar22._8_4_ = (int)lVar18;
          auVar22._0_8_ = lVar18;
          auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar21._0_8_ = (long)pitch;
          auVar21._8_4_ = pitch;
          auVar21._12_4_ = pitch >> 0x1f;
          uVar17 = 0;
          auVar22 = auVar22 ^ _DAT_0015d0d0;
          auVar23._8_4_ = 0xffffffff;
          auVar23._0_8_ = 0xffffffffffffffff;
          auVar23._12_4_ = 0xffffffff;
          auVar25 = _DAT_0015d0c0;
          do {
            auVar26 = auVar25;
            if ((flags & 2U) != 0) {
              auVar26._0_8_ = SUB168(auVar25 ^ auVar23,0) + (ulong)(uint)height;
              auVar26._8_8_ = SUB168(auVar25 ^ auVar23,8) + (ulong)(uint)height;
            }
            auVar27 = auVar25 ^ auVar4;
            uVar28 = auVar26._8_8_;
            if ((bool)(~(auVar27._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar27._0_4_ ||
                        auVar22._4_4_ < auVar27._4_4_) & 1)) {
              *(uchar **)((long)__ptr + uVar17 * 8) =
                   dstBuf + (ulong)auVar26._0_4_ * (ulong)(uint)pitch +
                            ((auVar26._0_8_ >> 0x20) * (ulong)(uint)pitch +
                             (ulong)auVar26._0_4_ * (ulong)(uint)(pitch >> 0x1f) << 0x20);
            }
            if ((auVar27._12_4_ != auVar22._12_4_ || auVar27._8_4_ <= auVar22._8_4_) &&
                auVar27._12_4_ <= auVar22._12_4_) {
              *(uchar **)((long)__ptr + uVar17 * 8 + 8) =
                   dstBuf + (uVar28 & 0xffffffff) * (ulong)(uint)pitch +
                            ((uVar28 >> 0x20) * (ulong)(uint)pitch +
                             (uVar28 & 0xffffffff) * (auVar21._8_8_ >> 0x20) << 0x20);
            }
            auVar26 = _DAT_0015d0c0;
            uVar17 = uVar17 + 2;
            lVar18 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 2;
            auVar25._8_8_ = lVar18 + 2;
          } while ((height + 1U & 0xfffffffe) != uVar17);
          if (height < (int)uVar19) {
            uVar3 = *(undefined8 *)((long)__ptr + (ulong)(uint)height * 8 + -8);
            uVar10 = ~height + uVar19;
            auVar27._4_4_ = 0;
            auVar27._0_4_ = uVar10;
            auVar27._8_4_ = uVar10;
            auVar27._12_4_ = 0;
            uVar17 = 0;
            auVar27 = auVar27 ^ auVar4;
            do {
              auVar24._8_4_ = (int)uVar17;
              auVar24._0_8_ = uVar17;
              auVar24._12_4_ = (int)(uVar17 >> 0x20);
              auVar25 = (auVar24 | auVar26) ^ auVar4;
              if ((bool)(~(auVar25._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar25._0_4_ ||
                          auVar27._4_4_ < auVar25._4_4_) & 1)) {
                *(undefined8 *)((long)__ptr + uVar17 * 8 + uVar16 * 8) = uVar3;
              }
              if ((auVar25._12_4_ != auVar27._12_4_ || auVar25._8_4_ <= auVar27._8_4_) &&
                  auVar25._12_4_ <= auVar27._12_4_) {
                *(undefined8 *)((long)__ptr + uVar17 * 8 + uVar16 * 8 + 8) = uVar3;
              }
              uVar17 = uVar17 + 2;
            } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar17);
          }
          local_180 = (long)*(int *)((long)handle + 0x240);
          local_178 = __ptr;
          if (0 < local_180) {
            local_188 = *(long *)((long)handle + 0x338);
            lVar18 = 0;
            do {
              lVar12 = lVar18 * 0x60;
              uVar10 = *(int *)(local_188 + 0x1c + lVar12) * 8 + 0x1fU & 0xffffffe0;
              iVar7 = *(int *)(local_188 + 0xc + lVar12);
              pvVar8 = malloc((ulong)(iVar7 * uVar10 + 0x20));
              *(void **)(local_a8 + lVar18 * 8) = pvVar8;
              if (pvVar8 == (void *)0x0) {
LAB_0010e202:
                builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
                builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
                builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
                builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
                builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
                builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
                *(undefined4 *)((long)handle + 0x6d0) = 1;
                builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
                builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
                in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
                in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
                in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
                in_FS_OFFSET[-0x19] = 0x656e616c50565559;
                goto LAB_0010dbec;
              }
              pvVar9 = malloc((long)iVar7 * 8);
              *(void **)(local_148 + lVar18 * 8) = pvVar9;
              if (pvVar9 == (void *)0x0) goto LAB_0010e202;
              if (0 < iVar7) {
                uVar11 = 0;
                lVar15 = 0;
                do {
                  *(ulong *)((long)pvVar9 + lVar15 * 8) =
                       (ulong)uVar11 + ((long)pvVar8 + 0x1fU & 0xffffffffffffffe0);
                  lVar15 = lVar15 + 1;
                  uVar11 = uVar11 + uVar10;
                } while (iVar7 != lVar15);
              }
              JVar6 = (int)(*(int *)(lVar12 + local_188 + 8) * (-iVar1 & (width + iVar1) - 1U)) /
                      iVar1;
              aJStack_58[lVar18] = JVar6;
              uVar17 = (long)(int)(iVar7 * uVar19) / (long)iVar5;
              iVar7 = (int)uVar17;
              pvVar8 = malloc((long)iVar7 << 3);
              *(void **)(local_f8 + lVar18 * 8) = pvVar8;
              if (pvVar8 == (void *)0x0) goto LAB_0010e202;
              if (0 < iVar7) {
                puVar13 = local_168[lVar18];
                uVar16 = 0;
                do {
                  *(uchar **)((long)pvVar8 + uVar16 * 8) = puVar13;
                  if ((local_160 == (int *)0x0) ||
                     (JVar14 = local_160[lVar18], local_160[lVar18] == 0)) {
                    JVar14 = JVar6;
                  }
                  puVar13 = puVar13 + (int)JVar14;
                  uVar16 = uVar16 + 1;
                } while ((uVar17 & 0xffffffff) != uVar16);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != local_180);
          }
          iVar5 = _setjmp(local_170);
          if (iVar5 == 0) {
            if (0 < (int)uVar19) {
              uVar17 = 0;
              do {
                local_18c = 0;
                local_190 = 0;
                iVar5 = (int)uVar17;
                if (0 < *(int *)((long)handle + 0x240)) {
                  piVar20 = (int *)(*(long *)((long)handle + 0x338) + 0xc);
                  uVar17 = 0;
                  do {
                    jcopy_sample_rows(*(JSAMPARRAY *)(local_f8 + uVar17 * 8),
                                      (*piVar20 * iVar5) / *(int *)((long)handle + 0x3a4),
                                      *(JSAMPARRAY *)(local_148 + uVar17 * 8),0,*piVar20,
                                      aJStack_58[uVar17]);
                    uVar17 = uVar17 + 1;
                    piVar20 = piVar20 + 0x18;
                  } while ((long)uVar17 < (long)*(int *)((long)handle + 0x240));
                }
                (**(code **)(*(long *)((long)handle + 0x468) + 8))
                          (dinfo,local_148,&local_18c,*(undefined4 *)((long)handle + 0x3a4),
                           (void *)((long)local_178 + (long)iVar5 * 8),&local_190,
                           *(undefined4 *)((long)handle + 0x3a4));
                uVar10 = iVar5 + *(int *)((long)handle + 0x3a4);
                uVar17 = (ulong)uVar10;
              } while ((int)uVar10 < (int)uVar19);
            }
            jpeg_abort_decompress(dinfo);
            uVar19 = 0;
          }
          else {
            uVar19 = 0xffffffff;
          }
        }
        goto LAB_0010dbf1;
      }
      builtin_strncpy((char *)((long)handle + 0x638),"to CMYK ",8);
      builtin_strncpy((char *)((long)handle + 0x640),"pixels.",8);
      builtin_strncpy((char *)((long)handle + 0x628),"de YUV i",8);
      builtin_strncpy((char *)((long)handle + 0x630),"mages in",8);
      builtin_strncpy((char *)((long)handle + 0x618),"s(): Can",8);
      builtin_strncpy((char *)((long)handle + 0x620),"not deco",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
      builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      in_FS_OFFSET[-0x14] = 0x204b594d43206f74;
      in_FS_OFFSET[-0x13] = 0x2e736c65786970;
      in_FS_OFFSET[-0x16] = 0x6920565559206564;
      in_FS_OFFSET[-0x15] = 0x6e6920736567616d;
      in_FS_OFFSET[-0x18] = 0x6e6143203a292873;
      in_FS_OFFSET[-0x17] = 0x6f63656420746f6e;
      in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
      in_FS_OFFSET[-0x19] = 0x656e616c50565559;
    }
    __ptr = (void *)0x0;
  }
LAB_0010dbec:
  uVar19 = 0xffffffff;
LAB_0010dbf1:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(dinfo);
  }
  free(__ptr);
  lVar18 = 0;
  do {
    free(*(void **)(local_148 + lVar18 * 8));
    free(*(void **)(local_a8 + lVar18 * 8));
    free(*(void **)(local_f8 + lVar18 * 8));
    lVar18 = lVar18 + 1;
  } while (lVar18 != 10);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar19;
}

Assistant:

DLLEXPORT int tjDecodeYUVPlanes(tjhandle handle,
                                const unsigned char **srcPlanes,
                                const int *strides, int subsamp,
                                unsigned char *dstBuf, int width, int pitch,
                                int height, int pixelFormat, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *inbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;
  int (*old_read_markers) (j_decompress_ptr);
  void (*old_reset_marker_reader) (j_decompress_ptr);

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecodeYUVPlanes(): Instance has not been initialized for decompression");

  if (!srcPlanes || !srcPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT ||
      dstBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROW("tjDecodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjDecodeYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (pixelFormat == TJPF_CMYK)
    THROW("tjDecodeYUVPlanes(): Cannot decode YUV images into CMYK pixels.");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];
  dinfo->image_width = width;
  dinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  dinfo->progressive_mode = dinfo->inputctl->has_multiple_scans = FALSE;
  dinfo->Ss = dinfo->Ah = dinfo->Al = 0;
  dinfo->Se = DCTSIZE2 - 1;
  if (setDecodeDefaults(dinfo, pixelFormat, subsamp, flags) == -1) {
    retval = -1;  goto bailout;
  }
  old_read_markers = dinfo->marker->read_markers;
  dinfo->marker->read_markers = my_read_markers;
  old_reset_marker_reader = dinfo->marker->reset_marker_reader;
  dinfo->marker->reset_marker_reader = my_reset_marker_reader;
  jpeg_read_header(dinfo, TRUE);
  dinfo->marker->read_markers = old_read_markers;
  dinfo->marker->reset_marker_reader = old_reset_marker_reader;

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  if (flags & TJFLAG_FASTDCT) this->dinfo.dct_method = JDCT_FASTEST;
  dinfo->do_fancy_upsampling = FALSE;
  dinfo->Se = DCTSIZE2 - 1;
  jinit_master_decompress(dinfo);
  (*dinfo->upsample->start_pass) (dinfo);

  pw0 = PAD(width, dinfo->max_h_samp_factor);
  ph0 = PAD(height, dinfo->max_v_samp_factor);

  if (pitch == 0) pitch = dinfo->output_width * tjPixelSize[pixelFormat];

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjDecodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = &dstBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = &dstBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < dinfo->num_components; i++) {
    compptr = &dinfo->comp_info[i];
    _tmpbuf[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] =
        &_tmpbuf_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / dinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / dinfo->max_v_samp_factor;
    inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!inbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += dinfo->max_v_samp_factor) {
    JDIMENSION inrow = 0, outrow = 0;

    for (i = 0, compptr = dinfo->comp_info; i < dinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(inbuf[i],
        row * compptr->v_samp_factor / dinfo->max_v_samp_factor, tmpbuf[i], 0,
        compptr->v_samp_factor, pw[i]);
    (dinfo->upsample->upsample) (dinfo, tmpbuf, &inrow,
                                 dinfo->max_v_samp_factor, &row_pointer[row],
                                 &outrow, dinfo->max_v_samp_factor);
  }
  jpeg_abort_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(inbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}